

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int extraout_EDX;
  uint uVar13;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar14;
  long lVar15;
  secp256k1_modinv32_signed30 *b;
  long *extraout_RDX_01;
  uint uVar16;
  uint uVar17;
  secp256k1_modinv32_signed30 *psVar18;
  int *piVar19;
  secp256k1_fe *psVar20;
  uint uVar21;
  uint8_t *puVar22;
  secp256k1_modinv32_modinfo *psVar23;
  long lVar24;
  secp256k1_fe *psVar25;
  secp256k1_fe *psVar26;
  secp256k1_fe *r;
  secp256k1_modinv32_signed30 *psVar27;
  secp256k1_modinv32_signed30 *psVar28;
  long lVar29;
  ulong uVar30;
  secp256k1_fe *r_00;
  uchar *__s;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  int *piVar35;
  uint uVar36;
  secp256k1_modinv32_modinfo *modinfo_00;
  secp256k1_modinv32_modinfo *psVar37;
  secp256k1_modinv32_signed30 *psVar38;
  code *pcVar39;
  uint uVar40;
  secp256k1_modinv32_signed30 *psVar41;
  ulong uVar42;
  secp256k1_modinv32_signed30 *psVar43;
  size_t count;
  uint uVar44;
  secp256k1_modinv32_signed30 *psVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar48;
  code *pcVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 e;
  ulong uStack_1590;
  secp256k1_fe *psStack_1588;
  uchar auStack_1580 [4232];
  secp256k1_fe *psStack_4f8;
  code *pcStack_4f0;
  undefined8 uStack_4e8;
  secp256k1_fe *psStack_4e0;
  code *pcStack_4d8;
  code *pcStack_4d0;
  undefined1 auStack_4c8 [36];
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  undefined1 auStack_488 [48];
  code *pcStack_458;
  secp256k1_fe sStack_450;
  secp256k1_fe sStack_420;
  secp256k1_fe sStack_3f0;
  ulong uStack_3b8;
  ulong uStack_3b0;
  ulong uStack_3a8;
  secp256k1_modinv32_signed30 *psStack_3a0;
  ulong uStack_398;
  code *pcStack_390;
  uint uStack_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  secp256k1_modinv32_signed30 *psStack_370;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint uStack_358;
  int32_t iStack_354;
  secp256k1_modinv32_signed30 *psStack_350;
  secp256k1_modinv32_signed30 *psStack_348;
  secp256k1_modinv32_signed30 *psStack_340;
  secp256k1_modinv32_signed30 *psStack_338;
  secp256k1_modinv32_signed30 *psStack_330;
  code *pcStack_328;
  long lStack_318;
  long lStack_310;
  int *piStack_308;
  secp256k1_modinv32_modinfo *psStack_300;
  ulong uStack_2f8;
  ulong uStack_2e8;
  code *pcStack_2e0;
  secp256k1_modinv32_signed30 *psStack_2d8;
  int *piStack_2c8;
  secp256k1_modinv32_modinfo *psStack_2c0;
  ulong uStack_2b8;
  ulong uStack_2a8;
  code *pcStack_2a0;
  secp256k1_modinv32_signed30 sStack_298;
  secp256k1_modinv32_signed30 sStack_274;
  secp256k1_modinv32_signed30 *psStack_250;
  secp256k1_modinv32_signed30 *psStack_248;
  secp256k1_modinv32_modinfo *psStack_238;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  secp256k1_modinv32_signed30 sStack_220;
  secp256k1_modinv32_trans2x2 sStack_1f0;
  secp256k1_modinv32_signed30 sStack_1e0;
  secp256k1_modinv32_signed30 *psStack_1b0;
  long lStack_1a8;
  secp256k1_modinv32_signed30 sStack_1a0;
  secp256k1_modinv32_signed30 sStack_170;
  secp256k1_modinv32_signed30 *psStack_148;
  secp256k1_modinv32_modinfo *psStack_140;
  secp256k1_modinv32_signed30 *psStack_138;
  secp256k1_modinv32_signed30 *psStack_130;
  secp256k1_modinv32_modinfo *psStack_128;
  code *pcStack_120;
  uint local_10c;
  secp256k1_modinv32_trans2x2 local_108;
  secp256k1_modinv32_signed30 local_f8;
  uint uStack_cc;
  secp256k1_modinv32_signed30 local_c8;
  secp256k1_modinv32_signed30 *local_a0;
  secp256k1_modinv32_modinfo *local_98;
  secp256k1_modinv32_signed30 *local_90;
  secp256k1_modinv32_signed30 local_88;
  secp256k1_modinv32_signed30 local_58;
  
  psVar45 = (secp256k1_modinv32_signed30 *)0x0;
  local_88.v[8] = 0;
  local_88.v[4] = 0;
  local_88.v[5] = 0;
  local_88.v[6] = 0;
  local_88.v[7] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[8] = 0;
  local_58.v[4] = 0;
  local_58.v[5] = 0;
  local_58.v[6] = 0;
  local_58.v[7] = 0;
  local_58.v[0] = 1;
  local_58.v[1] = 0;
  local_f8.v[8] = (modinfo->modulus).v[8];
  local_f8.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_f8.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_f8.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_f8.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_c8.v[8] = x->v[8];
  local_c8.v._0_8_ = *(undefined8 *)x->v;
  local_c8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_c8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_c8.v._24_8_ = *(undefined8 *)(x->v + 6);
  modinfo_00 = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar18 = (secp256k1_modinv32_signed30 *)0x9;
  puVar22 = secp256k1_modinv32_inv256;
  local_a0 = x;
  local_98 = modinfo;
  do {
    psVar37 = local_98;
    local_10c = (uint)psVar45;
    psVar23 = (secp256k1_modinv32_modinfo *)(local_f8.v._0_8_ & 0xffffffff);
    psVar27 = (secp256k1_modinv32_signed30 *)(local_c8.v._0_8_ & 0xffffffff);
    uVar34 = 1;
    psVar28 = (secp256k1_modinv32_signed30 *)0x0;
    iVar3 = 0x1e;
    uVar12 = 0;
    psVar41 = (secp256k1_modinv32_signed30 *)0x1;
    uVar13 = local_f8.v[0];
    uVar31 = local_c8.v[0];
    while( true ) {
      uVar16 = -1 << ((byte)iVar3 & 0x1f) | uVar31;
      psVar43 = (secp256k1_modinv32_signed30 *)(ulong)uVar16;
      iVar8 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
        }
      }
      bVar7 = (byte)iVar8;
      uVar31 = uVar31 >> (bVar7 & 0x1f);
      uVar40 = (int)psVar41 << (bVar7 & 0x1f);
      psVar41 = (secp256k1_modinv32_signed30 *)(ulong)uVar40;
      uVar12 = uVar12 << (bVar7 & 0x1f);
      uVar16 = (int)modinfo_00 - iVar8;
      modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)uVar16;
      iVar3 = iVar3 - iVar8;
      iVar8 = (int)psVar28;
      local_90 = psVar18;
      if (iVar3 == 0) break;
      if ((uVar13 & 1) == 0) {
        pcStack_120 = (code *)0x14b313;
        secp256k1_modinv32_var_cold_7();
LAB_0014b313:
        pcStack_120 = (code *)0x14b318;
        secp256k1_modinv32_var_cold_6();
LAB_0014b318:
        pcStack_120 = (code *)0x14b31d;
        secp256k1_modinv32_var_cold_1();
LAB_0014b31d:
        pcStack_120 = (code *)0x14b322;
        secp256k1_modinv32_var_cold_2();
LAB_0014b322:
        pcStack_120 = (code *)0x14b327;
        secp256k1_modinv32_var_cold_5();
LAB_0014b327:
        pcStack_120 = (code *)0x14b32c;
        secp256k1_modinv32_var_cold_4();
        goto LAB_0014b32c;
      }
      if ((uVar31 & 1) == 0) goto LAB_0014b313;
      uVar17 = uVar12 * local_c8.v[0] + uVar40 * local_f8.v[0];
      psVar43 = (secp256k1_modinv32_signed30 *)(ulong)uVar17;
      bVar7 = 0x1e - (char)iVar3;
      uVar44 = uVar13 << (bVar7 & 0x1f);
      psVar45 = (secp256k1_modinv32_signed30 *)(ulong)uVar44;
      if (uVar17 != uVar44) goto LAB_0014b318;
      uVar44 = uVar34 * local_c8.v[0] + iVar8 * local_f8.v[0];
      psVar45 = (secp256k1_modinv32_signed30 *)(ulong)uVar44;
      uVar17 = uVar31 << (bVar7 & 0x1f);
      psVar43 = (secp256k1_modinv32_signed30 *)(ulong)uVar17;
      if (uVar44 != uVar17) goto LAB_0014b31d;
      if (uVar16 - 0x2f0 < 0xfffffa21) goto LAB_0014b322;
      psVar45 = psVar28;
      if ((int)uVar16 < 0) {
        modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)-uVar16;
        uVar16 = -uVar13;
        uVar17 = -uVar12;
        psVar41 = psVar28;
        psVar45 = (secp256k1_modinv32_signed30 *)(ulong)-uVar40;
        uVar13 = uVar31;
        uVar31 = uVar16;
        uVar12 = uVar34;
        uVar34 = uVar17;
      }
      psVar43 = (secp256k1_modinv32_signed30 *)(ulong)uVar34;
      iVar8 = (int)modinfo_00 + 1;
      if (iVar3 <= iVar8) {
        iVar8 = iVar3;
      }
      if (iVar8 - 0x1fU < 0xffffffe2) goto LAB_0014b327;
      uVar40 = (uint)(0xff << (-(char)iVar8 & 0x1fU)) >> (-(char)iVar8 & 0x1fU);
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
      uVar16 = secp256k1_modinv32_inv256[uVar13 >> 1 & 0x7f] * uVar31 & uVar40;
      uVar31 = uVar31 + uVar16 * uVar13;
      psVar28 = (secp256k1_modinv32_signed30 *)(ulong)(uVar16 * (int)psVar41 + (int)psVar45);
      uVar34 = uVar16 * uVar12 + uVar34;
      if ((uVar31 & uVar40) != 0) {
LAB_0014b32c:
        pcStack_120 = (code *)0x14b331;
        secp256k1_modinv32_var_cold_3();
        goto LAB_0014b331;
      }
    }
    local_108.u = uVar40;
    local_108.v = uVar12;
    local_108.q = iVar8;
    local_108.r = uVar34;
    if ((long)(int)uVar34 * (long)(int)uVar40 - (long)iVar8 * (long)(int)uVar12 != 0x40000000) {
LAB_0014b331:
      pcStack_120 = (code *)0x14b336;
      secp256k1_modinv32_var_cold_8();
      psVar18 = psVar43;
      psVar37 = modinfo;
LAB_0014b336:
      pcStack_120 = (code *)0x14b33b;
      secp256k1_modinv32_var_cold_19();
LAB_0014b33b:
      pcStack_120 = (code *)0x14b340;
      secp256k1_modinv32_var_cold_18();
LAB_0014b340:
      pcStack_120 = (code *)0x14b345;
      secp256k1_modinv32_var_cold_17();
LAB_0014b345:
      pcStack_120 = (code *)0x14b34a;
      secp256k1_modinv32_var_cold_16();
LAB_0014b34a:
      pcStack_120 = (code *)0x14b34f;
      secp256k1_modinv32_var_cold_13();
LAB_0014b34f:
      pcStack_120 = (code *)0x14b354;
      secp256k1_modinv32_var_cold_12();
LAB_0014b354:
      pcStack_120 = (code *)0x14b359;
      secp256k1_modinv32_var_cold_11();
LAB_0014b359:
      pcStack_120 = (code *)0x14b35e;
      secp256k1_modinv32_var_cold_10();
LAB_0014b35e:
      pcStack_120 = (code *)0x14b363;
      secp256k1_modinv32_var_cold_9();
      goto LAB_0014b363;
    }
    pcStack_120 = (code *)0x14b078;
    secp256k1_modinv32_update_de_30(&local_88,&local_58,&local_108,local_98);
    psVar18 = local_90;
    psVar41 = &local_f8;
    iVar8 = (int)local_90;
    psVar23 = (secp256k1_modinv32_modinfo *)((ulong)local_90 & 0xffffffff);
    pcStack_120 = (code *)0x14b097;
    psVar27 = psVar41;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,iVar8,&psVar37->modulus,-1);
    if (iVar3 < 1) goto LAB_0014b336;
    psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
    pcStack_120 = (code *)0x14b0b1;
    psVar27 = psVar41;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,iVar8,&psVar37->modulus,1);
    if (0 < iVar3) goto LAB_0014b33b;
    psVar45 = &local_c8;
    psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
    pcStack_120 = (code *)0x14b0d0;
    psVar27 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,iVar8,&psVar37->modulus,-1);
    if (iVar3 < 1) goto LAB_0014b340;
    psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
    pcStack_120 = (code *)0x14b0ea;
    psVar27 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,iVar8,&psVar37->modulus,1);
    if (-1 < iVar3) goto LAB_0014b345;
    pcStack_120 = (code *)0x14b104;
    secp256k1_modinv32_update_fg_30_var(iVar8,psVar41,psVar45,&local_108);
    uVar34 = local_10c;
    psVar45 = (secp256k1_modinv32_signed30 *)(ulong)local_10c;
    if (local_c8.v[0] != 0) {
LAB_0014b114:
      uVar13 = local_f8.v[(long)iVar8 + -1];
      uVar31 = (&uStack_cc)[iVar8];
      iVar3 = iVar8 + -2;
      uVar12 = (int)uVar13 >> 0x1f ^ uVar13 | iVar3 >> 0x1f;
      psVar27 = (secp256k1_modinv32_signed30 *)(ulong)uVar12;
      uVar12 = (int)uVar31 >> 0x1f ^ uVar31 | uVar12;
      psVar23 = (secp256k1_modinv32_modinfo *)(ulong)uVar12;
      if (uVar12 == 0) {
        psVar18 = (secp256k1_modinv32_signed30 *)(ulong)(iVar8 - 1);
        local_f8.v[iVar3] = local_f8.v[iVar3] | uVar13 << 0x1e;
        local_c8.v[iVar3] = local_c8.v[iVar3] | uVar31 << 0x1e;
      }
      if (0x17 < (int)local_10c) goto LAB_0014b34a;
      iVar8 = (int)psVar18;
      psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
      pcStack_120 = (code *)0x14b16a;
      psVar27 = psVar41;
      iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,iVar8,&psVar37->modulus,-1);
      if (iVar3 < 1) goto LAB_0014b34f;
      psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
      pcStack_120 = (code *)0x14b184;
      psVar27 = psVar41;
      iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,iVar8,&psVar37->modulus,1);
      if (0 < iVar3) goto LAB_0014b354;
      psVar41 = &local_c8;
      psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
      pcStack_120 = (code *)0x14b1a3;
      psVar27 = psVar41;
      iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,iVar8,&psVar37->modulus,-1);
      if (iVar3 < 1) goto LAB_0014b359;
      psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
      pcStack_120 = (code *)0x14b1bd;
      psVar27 = psVar41;
      iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,iVar8,&psVar37->modulus,1);
      if (iVar3 < 0) {
        psVar45 = (secp256k1_modinv32_signed30 *)(ulong)(uVar34 + 1);
        uVar13 = 1;
        goto LAB_0014b1f0;
      }
      goto LAB_0014b35e;
    }
    uVar13 = 0;
    if (1 < iVar8) {
      uVar48 = 1;
      do {
        uVar13 = uVar13 | local_c8.v[uVar48];
        uVar48 = uVar48 + 1;
      } while (((ulong)psVar18 & 0xffffffff) != uVar48);
      if (uVar13 != 0) goto LAB_0014b114;
      uVar13 = 0;
    }
LAB_0014b1f0:
    modinfo = psVar37;
  } while ((char)uVar13 != '\0');
  psVar27 = &local_c8;
  iVar8 = (int)psVar18;
  psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
  pcStack_120 = (code *)0x14b20d;
  iVar3 = secp256k1_modinv32_mul_cmp_30(psVar27,iVar8,&SECP256K1_SIGNED30_ONE,0);
  if (iVar3 == 0) {
    pcStack_120 = (code *)0x14b22d;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&local_f8,iVar8,&SECP256K1_SIGNED30_ONE,-1);
    psVar45 = local_a0;
    if (iVar3 == 0) {
LAB_0014b2cb:
      pcStack_120 = (code *)0x14b2e5;
      secp256k1_modinv32_normalize_30(&local_88,local_f8.v[(long)iVar8 + -1],psVar37);
      psVar45->v[8] = local_88.v[8];
      *(undefined8 *)(psVar45->v + 4) = local_88.v._16_8_;
      *(undefined8 *)(psVar45->v + 6) = local_88.v._24_8_;
      *(undefined8 *)psVar45->v = local_88.v._0_8_;
      *(undefined8 *)(psVar45->v + 2) = local_88.v._8_8_;
      return;
    }
    pcStack_120 = (code *)0x14b252;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&local_f8,iVar8,&SECP256K1_SIGNED30_ONE,1);
    if (iVar3 == 0) goto LAB_0014b2cb;
    psVar23 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_120 = (code *)0x14b26c;
    psVar27 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar3 == 0) {
      psVar27 = &local_88;
      psVar23 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_120 = (code *)0x14b28f;
      iVar3 = secp256k1_modinv32_mul_cmp_30(psVar27,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar3 == 0) {
        pcStack_120 = (code *)0x14b2ab;
        iVar3 = secp256k1_modinv32_mul_cmp_30(&local_f8,iVar8,&psVar37->modulus,1);
        if (iVar3 == 0) goto LAB_0014b2cb;
        psVar27 = &local_f8;
        psVar23 = (secp256k1_modinv32_modinfo *)((ulong)psVar18 & 0xffffffff);
        pcStack_120 = (code *)0x14b2c3;
        iVar3 = secp256k1_modinv32_mul_cmp_30(psVar27,iVar8,&psVar37->modulus,-1);
        if (iVar3 == 0) goto LAB_0014b2cb;
      }
    }
  }
  else {
LAB_0014b363:
    pcStack_120 = (code *)0x14b368;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_120 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_120 = (code *)secp256k1_modinv32_inv256;
  psStack_128 = psVar37;
  psStack_130 = psVar45;
  psStack_138 = psVar41;
  psStack_140 = modinfo_00;
  psStack_148 = psVar18;
  uVar34 = 0;
  sStack_1a0.v[8] = 0;
  sStack_1a0.v[4] = 0;
  sStack_1a0.v[5] = 0;
  sStack_1a0.v[6] = 0;
  sStack_1a0.v[7] = 0;
  sStack_1a0.v[0] = 0;
  sStack_1a0.v[1] = 0;
  sStack_1a0.v[2] = 0;
  sStack_1a0.v[3] = 0;
  sStack_170.v[2] = 0;
  sStack_170.v[3] = 0;
  sStack_170.v[8] = 0;
  sStack_170.v[4] = 0;
  sStack_170.v[5] = 0;
  sStack_170.v[6] = 0;
  sStack_170.v[7] = 0;
  sStack_170.v[0] = 1;
  sStack_170.v[1] = 0;
  sStack_220.v[8] = (psVar23->modulus).v[8];
  sStack_220.v._16_8_ = *(undefined8 *)((psVar23->modulus).v + 4);
  sStack_220.v._24_8_ = *(undefined8 *)((psVar23->modulus).v + 6);
  sStack_220.v._0_8_ = *(undefined8 *)(psVar23->modulus).v;
  sStack_220.v._8_8_ = *(undefined8 *)((psVar23->modulus).v + 2);
  sStack_1e0.v[8] = psVar27->v[8];
  sStack_1e0.v._0_8_ = *(undefined8 *)psVar27->v;
  sStack_1e0.v._8_8_ = *(undefined8 *)(psVar27->v + 2);
  psStack_1b0 = psVar27;
  sStack_1e0.v._16_8_ = *(undefined8 *)(psVar27->v + 4);
  sStack_1e0.v._24_8_ = *(undefined8 *)(psVar27->v + 6);
  uVar48 = 0xffffffff;
  psStack_238 = psVar23;
  do {
    lStack_1a8 = (long)sStack_220.v[0];
    uVar42 = (ulong)sStack_1e0.v[0];
    uVar10 = 0;
    psVar41 = (secp256k1_modinv32_signed30 *)0x1;
    uVar13 = 0;
    uVar16 = 0;
    uVar40 = 1;
    uVar31 = sStack_1e0.v[0];
    uVar12 = sStack_220.v[0];
    do {
      uVar17 = sStack_220.v[0];
      uStack_22c = uVar34;
      if ((uVar12 & 1) == 0) {
        psStack_248 = (secp256k1_modinv32_signed30 *)0x14b843;
        secp256k1_modinv32_cold_17();
LAB_0014b843:
        psStack_248 = (secp256k1_modinv32_signed30 *)0x14b848;
        secp256k1_modinv32_cold_1();
LAB_0014b848:
        psStack_248 = (secp256k1_modinv32_signed30 *)0x14b84d;
        secp256k1_modinv32_cold_2();
        psVar37 = modinfo_00;
LAB_0014b84d:
        psStack_248 = (secp256k1_modinv32_signed30 *)0x14b852;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b852;
      }
      uVar33 = (uint)psVar41;
      uVar21 = uVar13 * sStack_1e0.v[0] + uVar33 * sStack_220.v[0];
      puVar22 = (uint8_t *)(ulong)uVar21;
      uVar44 = uVar12 << ((byte)uVar10 & 0x1f);
      psVar18 = (secp256k1_modinv32_signed30 *)(ulong)uVar44;
      if (uVar21 != uVar44) goto LAB_0014b843;
      uVar21 = uVar40 * sStack_1e0.v[0] + uVar16 * sStack_220.v[0];
      puVar22 = (uint8_t *)(ulong)uVar21;
      uVar44 = uVar31 << ((byte)uVar10 & 0x1f);
      psVar18 = (secp256k1_modinv32_signed30 *)(ulong)uVar44;
      if (uVar21 != uVar44) goto LAB_0014b848;
      uStack_224 = (int)(uint)uVar48 >> 0x1f;
      puVar22 = (uint8_t *)(ulong)uStack_224;
      uStack_228 = uVar31 & 1;
      uVar44 = -uStack_228;
      psVar45 = (secp256k1_modinv32_signed30 *)(ulong)uVar44;
      uVar21 = uStack_224 & uVar44;
      psVar18 = (secp256k1_modinv32_signed30 *)(ulong)uVar21;
      uVar46 = (uint)uVar48 ^ uVar21;
      uVar48 = (ulong)uVar46;
      psVar37 = (secp256k1_modinv32_modinfo *)(ulong)(uVar46 - 0x25b);
      if (uVar46 - 0x25b < 0xfffffb4d) goto LAB_0014b84d;
      uVar48 = (ulong)(uVar46 - 1);
      uVar40 = uVar40 + ((uStack_224 ^ uVar13) - uStack_224 & uVar44);
      uVar13 = (uVar13 + (uVar40 & uVar21)) * 2;
      uVar16 = uVar16 + ((uStack_224 ^ uVar33) - uStack_224 & uVar44);
      uVar33 = (uVar33 + (uVar16 & uVar21)) * 2;
      psVar41 = (secp256k1_modinv32_signed30 *)(ulong)uVar33;
      uVar44 = ((uStack_224 ^ uVar12) - uStack_224 & uVar44) + uVar31;
      uVar31 = uVar44 >> 1;
      uVar44 = uVar44 & uVar21;
      modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)uVar44;
      uVar12 = uVar12 + uVar44;
      uVar44 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar44;
    } while (uVar44 != 0x1e);
    psVar18 = (secp256k1_modinv32_signed30 *)(long)(int)uVar33;
    psVar45 = (secp256k1_modinv32_signed30 *)(long)(int)uVar40;
    puVar22 = (uint8_t *)(long)(int)uVar13;
    psVar37 = (secp256k1_modinv32_modinfo *)(long)(int)uVar16;
    uVar10 = (long)psVar18 * (long)psVar45 - (long)puVar22 * (long)psVar37;
    sStack_1f0.u = uVar33;
    sStack_1f0.v = uVar13;
    sStack_1f0.q = uVar16;
    sStack_1f0.r = uVar40;
    if (uVar10 != 0x40000000) {
LAB_0014b852:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b857;
      secp256k1_modinv32_cold_3();
LAB_0014b857:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b85c;
      secp256k1_modinv32_cold_15();
LAB_0014b85c:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b861;
      secp256k1_modinv32_cold_14();
LAB_0014b861:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b866;
      secp256k1_modinv32_cold_13();
LAB_0014b866:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b86b;
      secp256k1_modinv32_cold_12();
LAB_0014b86b:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b870;
      secp256k1_modinv32_cold_4();
LAB_0014b870:
      modinfo_00 = psVar37;
      uVar34 = (uint)uVar10;
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b875;
      secp256k1_modinv32_cold_5();
LAB_0014b875:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b87a;
      secp256k1_modinv32_cold_11();
LAB_0014b87a:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b87f;
      secp256k1_modinv32_cold_10();
LAB_0014b87f:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b884;
      secp256k1_modinv32_cold_9();
LAB_0014b884:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b889;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b889;
    }
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b556;
    secp256k1_modinv32_update_de_30(&sStack_1a0,&sStack_170,&sStack_1f0,psStack_238);
    psVar41 = &sStack_220;
    uVar17 = 9;
    uVar10 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b56f;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,9,&psStack_238->modulus,-1);
    if (iVar3 < 1) goto LAB_0014b857;
    psVar41 = &sStack_220;
    uVar17 = 9;
    uVar10 = 1;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b590;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,9,&psStack_238->modulus,1);
    if (0 < iVar3) goto LAB_0014b85c;
    psVar41 = &sStack_1e0;
    uVar17 = 9;
    uVar10 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b5b1;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,9,&psStack_238->modulus,-1);
    if (iVar3 < 1) goto LAB_0014b861;
    psVar41 = &sStack_1e0;
    uVar17 = 9;
    uVar10 = 1;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b5d2;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,9,&psStack_238->modulus,1);
    modinfo_00 = psStack_238;
    if (-1 < iVar3) goto LAB_0014b866;
    uVar10 = (long)psVar18 * lStack_1a8;
    uVar5 = (long)puVar22 * uVar42 + uVar10;
    if ((uVar5 & 0x3ffffffe) != 0) goto LAB_0014b86b;
    uVar42 = uVar42 * (long)psVar45 + lStack_1a8 * (long)psVar37;
    if ((uVar42 & 0x3fffffff) != 0) goto LAB_0014b870;
    uVar42 = (long)uVar42 >> 0x1e;
    lVar6 = (long)uVar5 >> 0x1e;
    lVar11 = 1;
    do {
      lVar6 = (long)sStack_1e0.v[lVar11] * (long)puVar22 +
              (long)sStack_220.v[lVar11] * (long)psVar18 + lVar6;
      lVar24 = (long)sStack_1e0.v[lVar11] * (long)psVar45 +
               (long)sStack_220.v[lVar11] * (long)psVar37 + uVar42;
      (&uStack_224)[lVar11] = (uint)lVar6 & 0x3fffffff;
      sStack_1e0.v[lVar11 + -1] = (uint)lVar24 & 0x3fffffff;
      lVar11 = lVar11 + 1;
      uVar42 = lVar24 >> 0x1e;
      lVar6 = lVar6 >> 0x1e;
    } while (lVar11 != 9);
    sStack_220.v[8] = (int32_t)lVar6;
    sStack_1e0.v[8] = (int32_t)uVar42;
    psVar18 = &sStack_220;
    uVar17 = 9;
    uVar34 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b6a6;
    psVar41 = psVar18;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar18,9,&psStack_238->modulus,-1);
    if (iVar3 < 1) goto LAB_0014b875;
    uVar17 = 9;
    uVar34 = 1;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b6c3;
    psVar41 = psVar18;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar18,9,&modinfo_00->modulus,1);
    if (0 < iVar3) goto LAB_0014b87a;
    psVar18 = &sStack_1e0;
    uVar17 = 9;
    uVar34 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b6e5;
    psVar41 = psVar18;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar18,9,&modinfo_00->modulus,-1);
    if (iVar3 < 1) goto LAB_0014b87f;
    uVar17 = 9;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b702;
    psVar41 = psVar18;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar18,9,&modinfo_00->modulus,1);
    uVar34 = uStack_22c;
    if (-1 < iVar3) goto LAB_0014b884;
    uVar34 = uStack_22c + 1;
  } while (uVar34 != 0x14);
  psVar41 = &sStack_1e0;
  uVar17 = 9;
  uVar34 = 0;
  psStack_248 = (secp256k1_modinv32_signed30 *)0x14b731;
  iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar3 == 0) {
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b754;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&sStack_220,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar45 = psStack_1b0;
    if (iVar3 == 0) {
LAB_0014b7fe:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b815;
      secp256k1_modinv32_normalize_30(&sStack_1a0,sStack_220.v[8],modinfo_00);
      psVar45->v[8] = sStack_1a0.v[8];
      *(undefined8 *)(psVar45->v + 4) = sStack_1a0.v._16_8_;
      *(undefined8 *)(psVar45->v + 6) = sStack_1a0.v._24_8_;
      *(undefined8 *)psVar45->v = sStack_1a0.v._0_8_;
      *(undefined8 *)(psVar45->v + 2) = sStack_1a0.v._8_8_;
      return;
    }
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b77f;
    iVar3 = secp256k1_modinv32_mul_cmp_30(&sStack_220,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar3 == 0) goto LAB_0014b7fe;
    uVar17 = 9;
    uVar34 = 0;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b799;
    psVar41 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar3 == 0) {
      psVar41 = &sStack_1a0;
      uVar17 = 9;
      uVar34 = 0;
      psStack_248 = (secp256k1_modinv32_signed30 *)0x14b7bc;
      iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar3 == 0) {
        psStack_248 = (secp256k1_modinv32_signed30 *)0x14b7db;
        iVar3 = secp256k1_modinv32_mul_cmp_30(&sStack_220,9,&modinfo_00->modulus,1);
        if (iVar3 == 0) goto LAB_0014b7fe;
        psVar41 = &sStack_220;
        uVar17 = 9;
        uVar34 = 0xffffffff;
        psStack_248 = (secp256k1_modinv32_signed30 *)0x14b7f6;
        iVar3 = secp256k1_modinv32_mul_cmp_30(psVar41,9,&modinfo_00->modulus,-1);
        if (iVar3 == 0) goto LAB_0014b7fe;
      }
    }
  }
  else {
LAB_0014b889:
    psStack_248 = (secp256k1_modinv32_signed30 *)0x14b88e;
    secp256k1_modinv32_cold_6();
  }
  psStack_248 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  psVar27 = &sStack_298;
  piVar19 = (int *)(ulong)uVar34;
  pcStack_2a0 = (code *)0x14b8b3;
  psStack_250 = psVar18;
  psStack_248 = psVar45;
  secp256k1_modinv32_mul_30(&sStack_274,psVar41,uVar17,1);
  pcStack_2a0 = (code *)0x14b8c5;
  piVar35 = piVar19;
  psVar45 = a_00;
  secp256k1_modinv32_mul_30(&sStack_298,a_00,9,uVar34);
  lVar6 = 0;
  while ((uint)sStack_274.v[lVar6] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_298.v[lVar6]) goto LAB_0014b917;
    lVar6 = lVar6 + 1;
    if (lVar6 == 8) {
      uVar34 = 8;
      while( true ) {
        if (sStack_274.v[uVar34] < sStack_298.v[uVar34]) {
          return;
        }
        if (sStack_298.v[uVar34] < sStack_274.v[uVar34]) break;
        bVar50 = uVar34 == 0;
        uVar34 = uVar34 - 1;
        if (bVar50) {
          return;
        }
      }
      return;
    }
  }
  pcStack_2a0 = (code *)0x14b917;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b917:
  pcStack_2a0 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar3 = (int)psVar27;
  piStack_2c8 = piVar19;
  psStack_2c0 = modinfo_00;
  uStack_2b8 = uVar42;
  uStack_2a8 = uVar48;
  pcStack_2a0 = (code *)puVar22;
  if (iVar3 < 1) {
    psStack_2d8 = (secp256k1_modinv32_signed30 *)0x14ba0a;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014ba0a:
    iVar9 = (int)piVar35;
    psStack_2d8 = (secp256k1_modinv32_signed30 *)0x14ba0f;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar8 = piVar35[1];
    iVar1 = *piVar35;
    piVar19 = (int *)(long)psVar45->v[0];
    uVar10 = (long)*extraout_RDX * (long)iVar8 + (long)piVar19 * (long)iVar1;
    if ((uVar10 & 0x3fffffff) != 0) goto LAB_0014ba0a;
    iVar2 = piVar35[3];
    iVar9 = piVar35[2];
    piVar19 = (int *)((long)piVar19 * (long)iVar9);
    piVar35 = (int *)((long)*extraout_RDX * (long)iVar2 + (long)piVar19);
    if (((ulong)piVar35 & 0x3fffffff) == 0) {
      lVar11 = (long)piVar35 >> 0x1e;
      lVar6 = (long)uVar10 >> 0x1e;
      if (iVar3 != 1) {
        uVar48 = 1;
        do {
          lVar6 = (long)extraout_RDX[uVar48] * (long)iVar8 +
                  (long)psVar45->v[uVar48] * (long)iVar1 + lVar6;
          lVar11 = (long)extraout_RDX[uVar48] * (long)iVar2 +
                   (long)psVar45->v[uVar48] * (long)iVar9 + lVar11;
          psVar45->v[uVar48 - 1] = (uint)lVar6 & 0x3fffffff;
          extraout_RDX[uVar48 - 1] = (uint)lVar11 & 0x3fffffff;
          uVar48 = uVar48 + 1;
          lVar11 = lVar11 >> 0x1e;
          lVar6 = lVar6 >> 0x1e;
        } while (((ulong)psVar27 & 0xffffffff) != uVar48);
      }
      psVar45->v[(long)iVar3 + -1] = (int32_t)lVar6;
      extraout_RDX[(long)iVar3 + -1] = (int)lVar11;
      return;
    }
  }
  psStack_2d8 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar6 = 0;
  psStack_2d8 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar6 < extraout_EDX) {
      psStack_2d8 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_2d8->v + (long)psVar45->v[lVar6] * (long)iVar9);
    }
    psVar27->v[lVar6] = (uint)psStack_2d8 & 0x3fffffff;
    psStack_2d8 = (secp256k1_modinv32_signed30 *)((long)psStack_2d8 >> 0x1e);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  if (8 < extraout_EDX) {
    psStack_2d8 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_2d8->v + (long)psVar45->v[8] * (long)iVar9);
  }
  psVar18 = (secp256k1_modinv32_signed30 *)(long)(int)psStack_2d8;
  if (psVar18 == psStack_2d8) {
    psVar27->v[8] = (int)psStack_2d8;
    return;
  }
  pcStack_2e0 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar34 = *extraout_RDX_00;
  psVar43 = (secp256k1_modinv32_signed30 *)(long)(int)uVar34;
  uVar13 = extraout_RDX_00[1];
  lVar6 = (long)(int)uVar13;
  uVar31 = extraout_RDX_00[2];
  psVar41 = (secp256k1_modinv32_signed30 *)(long)(int)uVar31;
  lStack_318 = (long)(int)extraout_RDX_00[3];
  psVar25 = (secp256k1_fe *)0x9;
  pcStack_328 = (code *)0x14baa9;
  psVar28 = psVar27;
  piStack_308 = piVar19;
  psStack_300 = modinfo_00;
  uStack_2f8 = uVar42;
  uStack_2e8 = uVar48;
  pcStack_2e0 = (code *)puVar22;
  iVar3 = secp256k1_modinv32_mul_cmp_30(psVar27,9,psVar18,-2);
  if (iVar3 < 1) {
    pcStack_328 = (code *)0x14bd11;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bd11:
    pcStack_328 = (code *)0x14bd16;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bd16:
    pcStack_328 = (code *)0x14bd1b;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bd1b:
    pcStack_328 = (code *)0x14bd20;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bd20:
    pcStack_328 = (code *)0x14bd25;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bd25:
    pcStack_328 = (code *)0x14bd2a;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bd2a:
    pcStack_328 = (code *)0x14bd2f;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bd2f:
    pcStack_328 = (code *)0x14bd34;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar38 = psVar18;
LAB_0014bd34:
    pcStack_328 = (code *)0x14bd39;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bd39:
    pcStack_328 = (code *)0x14bd3e;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bd3e:
    pcStack_328 = (code *)0x14bd43;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x14bac6;
    psVar28 = psVar27;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar27,9,psVar18,1);
    if (-1 < iVar3) goto LAB_0014bd11;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x14bae3;
    psVar28 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,9,psVar18,-2);
    if (iVar3 < 1) goto LAB_0014bd16;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x14bb00;
    psVar28 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,9,psVar18,1);
    if (-1 < iVar3) goto LAB_0014bd1b;
    psVar38 = (secp256k1_modinv32_signed30 *)-(long)psVar43;
    if (0 < (long)psVar43) {
      psVar38 = psVar43;
    }
    lVar11 = -lVar6;
    if (lVar6 < 1) {
      lVar11 = lVar6;
    }
    if (lVar11 + 0x40000000 < (long)psVar38) goto LAB_0014bd20;
    psVar38 = (secp256k1_modinv32_signed30 *)-(long)psVar41;
    if (0 < (long)psVar41) {
      psVar38 = psVar41;
    }
    lVar11 = -lStack_318;
    if (lStack_318 < 1) {
      lVar11 = lStack_318;
    }
    if (lVar11 + 0x40000000 < (long)psVar38) goto LAB_0014bd25;
    uVar16 = psVar27->v[8] >> 0x1f;
    uVar12 = psVar45->v[8] >> 0x1f;
    psVar25 = (secp256k1_fe *)(ulong)uVar12;
    iVar3 = (uVar12 & uVar13) + (uVar16 & uVar34);
    psVar28 = (secp256k1_modinv32_signed30 *)
              (psVar45->v[0] * lVar6 + (long)psVar27->v[0] * (long)psVar43);
    lVar11 = (long)(int)(iVar3 - ((int)psVar28 * psVar18[1].v[0] + iVar3 & 0x3fffffffU));
    piVar14 = (int32_t *)((long)psVar28->v + lVar11 * psVar18->v[0]);
    if (((ulong)piVar14 & 0x3fffffff) != 0) goto LAB_0014bd2a;
    lStack_310 = lVar11;
    iVar3 = (uVar12 & (uint)lStack_318) + (uVar16 & uVar31);
    lVar24 = psVar45->v[0] * lStack_318 + (long)psVar27->v[0] * (long)psVar41;
    psVar28 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar34 = iVar3 - (psVar18[1].v[0] * (int)lVar24 + iVar3 & 0x3fffffffU);
    psVar25 = (secp256k1_fe *)(ulong)uVar34;
    uVar48 = (long)psVar18->v[0] * (long)(int)uVar34 + lVar24;
    if ((uVar48 & 0x3fffffff) != 0) goto LAB_0014bd2f;
    lVar24 = (long)uVar48 >> 0x1e;
    lVar15 = (long)piVar14 >> 0x1e;
    lVar29 = 1;
    do {
      lVar15 = psVar18->v[lVar29] * lVar11 + psVar45->v[lVar29] * lVar6 +
               (long)psVar27->v[lVar29] * (long)psVar43 + lVar15;
      psVar38 = (secp256k1_modinv32_signed30 *)(psVar45->v[lVar29] * lStack_318);
      lVar24 = (long)psVar38->v +
               (long)psVar27->v[lVar29] * (long)psVar41 + lVar24 +
               (long)psVar18->v[lVar29] * (long)(int)uVar34;
      psVar27->v[lVar29 + -1] = (uint)lVar15 & 0x3fffffff;
      psVar45->v[lVar29 + -1] = (uint)lVar24 & 0x3fffffff;
      lVar29 = lVar29 + 1;
      lVar24 = lVar24 >> 0x1e;
      lVar15 = lVar15 >> 0x1e;
    } while (lVar29 != 9);
    psVar27->v[8] = (int32_t)lVar15;
    psVar45->v[8] = (int32_t)lVar24;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x14bcaa;
    psVar28 = psVar27;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar27,9,psVar18,-2);
    psVar41 = psVar45;
    psVar43 = psVar18;
    if (iVar3 < 1) goto LAB_0014bd34;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x14bcc7;
    psVar28 = psVar27;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar27,9,psVar18,1);
    if (-1 < iVar3) goto LAB_0014bd39;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x14bce0;
    psVar28 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,9,psVar18,-2);
    if (iVar3 < 1) goto LAB_0014bd3e;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x14bcf9;
    psVar28 = psVar45;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar45,9,psVar18,1);
    if (iVar3 < 0) {
      return;
    }
  }
  pcStack_328 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_328 = (code *)lVar6;
  psStack_330 = psVar27;
  psStack_338 = psVar45;
  psStack_340 = psVar43;
  psStack_348 = psVar38;
  psStack_350 = psVar41;
  uVar34 = psVar28->v[0];
  uVar30 = (ulong)uVar34;
  uVar13 = psVar28->v[3];
  uVar5 = (ulong)uVar13;
  uVar31 = psVar28->v[4];
  uVar10 = (ulong)uVar31;
  uVar12 = psVar28->v[5];
  uVar42 = (ulong)uVar12;
  psVar45 = (secp256k1_modinv32_signed30 *)(ulong)(uint)psVar28->v[6];
  uVar16 = psVar28->v[7];
  uVar48 = (ulong)uVar16;
  iStack_354 = psVar28->v[8];
  lVar6 = 0;
  do {
    if (psVar28->v[lVar6] < -0x3fffffff) {
      pcStack_390 = (code *)0x14c091;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014c091:
      pcStack_390 = (code *)0x14c096;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014c096;
    }
    if (0x3fffffff < psVar28->v[lVar6]) goto LAB_0014c091;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  uStack_374 = (uint)psVar25;
  psVar25 = (secp256k1_fe *)0x9;
  pcStack_390 = (code *)0x14bdce;
  psVar45 = psVar28;
  uStack_380 = psVar28->v[1];
  uStack_37c = psVar28->v[2];
  uStack_378 = psVar28->v[6];
  psStack_370 = b;
  iVar3 = secp256k1_modinv32_mul_cmp_30(psVar28,9,b,-2);
  if (iVar3 < 1) {
LAB_0014c096:
    pcStack_390 = (code *)0x14c09b;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014c09b:
    pcStack_390 = (code *)0x14c0a0;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014c0a0:
    pcStack_390 = (code *)0x14c0a5;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014c0a5:
    pcStack_390 = (code *)0x14c0aa;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_390 = (code *)0x14bded;
    psVar45 = psVar28;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar28,9,psStack_370,1);
    if (-1 < iVar3) goto LAB_0014c09b;
    uVar40 = iStack_354 >> 0x1f;
    uStack_358 = psStack_370->v[1];
    uVar17 = (uVar40 & uStack_358) + uStack_380;
    uStack_380 = psStack_370->v[2];
    uVar44 = (uVar40 & uStack_380) + uStack_37c;
    uStack_37c = psStack_370->v[3];
    uStack_35c = psStack_370->v[4];
    uStack_360 = psStack_370->v[5];
    uStack_364 = psStack_370->v[6];
    uVar46 = (uVar40 & uStack_364) + uStack_378;
    uStack_378 = psStack_370->v[7];
    uStack_384 = (int)uStack_374 >> 0x1f;
    uStack_374 = psStack_370->v[8];
    uVar33 = ((uVar40 & psStack_370->v[0]) + uVar34 ^ uStack_384) - uStack_384;
    uVar21 = ((int)uVar33 >> 0x1e) + ((uVar17 ^ uStack_384) - uStack_384);
    uVar17 = ((int)uVar21 >> 0x1e) + ((uVar44 ^ uStack_384) - uStack_384);
    uVar47 = ((int)uVar17 >> 0x1e) + (((uVar40 & uStack_37c) + uVar13 ^ uStack_384) - uStack_384);
    uVar13 = ((int)uVar47 >> 0x1e) + (((uVar40 & uStack_35c) + uVar31 ^ uStack_384) - uStack_384);
    uVar34 = ((int)uVar13 >> 0x1e) + (((uVar40 & uStack_360) + uVar12 ^ uStack_384) - uStack_384);
    uVar31 = ((int)uVar34 >> 0x1e) + ((uVar46 ^ uStack_384) - uStack_384);
    uVar12 = ((int)uVar31 >> 0x1e) + (((uVar40 & uStack_378) + uVar16 ^ uStack_384) - uStack_384);
    uVar36 = ((int)uVar12 >> 0x1e) +
             (((uVar40 & uStack_374) + iStack_354 ^ uStack_384) - uStack_384);
    uVar42 = (ulong)uVar36;
    uStack_388 = (int)uVar36 >> 0x1f;
    uVar46 = (psStack_370->v[0] & uStack_388) + (uVar33 & 0x3fffffff);
    uVar44 = (uStack_360 & uStack_388) + (uVar34 & 0x3fffffff);
    uVar30 = (ulong)uVar44;
    uVar33 = (uStack_364 & uStack_388) + (uVar31 & 0x3fffffff);
    uVar5 = (ulong)uVar33;
    uVar34 = ((int)uVar46 >> 0x1e) + (uStack_358 & uStack_388) + (uVar21 & 0x3fffffff);
    uVar31 = ((int)uVar34 >> 0x1e) + (uStack_380 & uStack_388) + (uVar17 & 0x3fffffff);
    uVar16 = ((int)uVar31 >> 0x1e) + (uStack_37c & uStack_388) + (uVar47 & 0x3fffffff);
    uVar40 = ((int)uVar16 >> 0x1e) + (uStack_35c & uStack_388) + (uVar13 & 0x3fffffff);
    uVar44 = ((int)uVar40 >> 0x1e) + uVar44;
    uVar33 = ((int)uVar44 >> 0x1e) + uVar33;
    uVar13 = ((int)uVar33 >> 0x1e) + (uStack_378 & uStack_388) + (uVar12 & 0x3fffffff);
    uVar12 = ((int)uVar13 >> 0x1e) + (uStack_374 & uStack_388) + uVar36;
    uVar10 = (ulong)uVar12;
    uVar16 = uVar16 & 0x3fffffff;
    psVar25 = (secp256k1_fe *)(ulong)uVar16;
    uVar40 = uVar40 & 0x3fffffff;
    psVar45 = (secp256k1_modinv32_signed30 *)(ulong)uVar40;
    uVar13 = uVar13 & 0x3fffffff;
    uVar48 = (ulong)uVar13;
    psVar28->v[0] = uVar46 & 0x3fffffff;
    psVar28->v[1] = uVar34 & 0x3fffffff;
    psVar28->v[2] = uVar31 & 0x3fffffff;
    psVar28->v[3] = uVar16;
    psVar28->v[4] = uVar40;
    psVar28->v[5] = uVar44 & 0x3fffffff;
    psVar28->v[6] = uVar33 & 0x3fffffff;
    psVar28->v[7] = uVar13;
    psVar28->v[8] = uVar12;
    if (0x3fffffff < uVar12) goto LAB_0014c0a0;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_390 = (code *)0x14c05e;
    psVar45 = psVar28;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar28,9,psStack_370,0);
    if (iVar3 < 0) goto LAB_0014c0a5;
    psVar25 = (secp256k1_fe *)0x9;
    pcStack_390 = (code *)0x14c079;
    psVar45 = psVar28;
    iVar3 = secp256k1_modinv32_mul_cmp_30(psVar28,9,psStack_370,1);
    if (iVar3 < 0) {
      return;
    }
  }
  pcStack_390 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_450;
  psVar20 = &sStack_450;
  pcVar39 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar39 = secp256k1_fe_inv;
  }
  pcStack_458 = (code *)0x14c0e0;
  uStack_3b8 = uVar48;
  uStack_3b0 = uVar42;
  uStack_3a8 = uVar5;
  psStack_3a0 = psVar28;
  uStack_398 = uVar30;
  pcStack_390 = (code *)uVar10;
  (*pcVar39)(&sStack_450);
  if (psVar45 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar45->v + 8) = sStack_450.n[4];
    *(ulong *)(psVar45[1].v + 1) = CONCAT44(sStack_450.normalized,sStack_450.magnitude);
    *(uint64_t *)(psVar45->v + 4) = sStack_450.n[2];
    *(uint64_t *)(psVar45->v + 6) = sStack_450.n[3];
    *(uint64_t *)psVar45->v = sStack_450.n[0];
    *(uint64_t *)(psVar45->v + 2) = sStack_450.n[1];
  }
  uVar10 = 0xffffffffffff;
  sStack_3f0.n[0] = psVar25->n[0];
  sStack_3f0.n[1] = psVar25->n[1];
  sStack_3f0.n[2] = psVar25->n[2];
  sStack_3f0.n[3] = psVar25->n[3];
  sStack_3f0.n[4] = psVar25->n[4];
  sStack_3f0.magnitude = psVar25->magnitude;
  sStack_3f0.normalized = psVar25->normalized;
  psVar26 = &sStack_3f0;
  pcStack_458 = (code *)0x14c149;
  secp256k1_fe_verify(psVar26);
  uVar48 = (sStack_3f0.n[4] >> 0x30) * 0x1000003d1 + sStack_3f0.n[0];
  if (((uVar48 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar48 & 0xfffffffffffff) == 0)) {
    uVar42 = (uVar48 >> 0x34) + sStack_3f0.n[1];
    uVar5 = (uVar42 >> 0x34) + sStack_3f0.n[2];
    uVar30 = (uVar5 >> 0x34) + sStack_3f0.n[3];
    uVar32 = (uVar30 >> 0x34) + (sStack_3f0.n[4] & 0xffffffffffff);
    if ((((uVar42 | uVar48 | uVar5 | uVar30) & 0xfffffffffffff) != 0 || uVar32 != 0) &&
       (((uVar48 | 0x1000003d0) & uVar42 & uVar5 & uVar30 & (uVar32 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c1f0;
LAB_0014c5ba:
    pcStack_458 = (code *)0x14c5c5;
    secp256k1_fe_verify(&sStack_450);
    uVar10 = sStack_450.n[4] & 0xffffffffffff;
    uVar48 = (sStack_450.n[4] >> 0x30) * 0x1000003d1 + sStack_450.n[0];
    uVar42 = (uVar48 >> 0x34) + sStack_450.n[1];
    uVar5 = (uVar42 >> 0x34) + sStack_450.n[2];
    r = (secp256k1_fe *)((uVar5 >> 0x34) + sStack_450.n[3]);
    uVar30 = ((ulong)r >> 0x34) + uVar10;
    if ((((uVar42 | uVar48 | uVar5 | (ulong)r) & 0xfffffffffffff) == 0 && uVar30 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar30 ^ 0xf000000000000), psVar20 = &sStack_450,
       ((uVar48 ^ 0x1000003d0) & uVar42 & uVar5 & (ulong)r & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0014c1f0:
    pcStack_458 = (code *)0x14c203;
    psVar26 = psVar25;
    secp256k1_fe_mul(&sStack_3f0,psVar25,&sStack_450);
    pcStack_458 = (code *)0x14c20b;
    secp256k1_fe_verify(&sStack_3f0);
    r_00 = &fe_minus_one;
    pcStack_458 = (code *)0x14c217;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_3f0.magnitude < 0x20) {
      sStack_3f0.n[0] = sStack_3f0.n[0] + 0xffffefffffc2e;
      sStack_3f0.n[1] = sStack_3f0.n[1] + 0xfffffffffffff;
      sStack_3f0.n[2] = sStack_3f0.n[2] + 0xfffffffffffff;
      sStack_3f0.n[3] = sStack_3f0.n[3] + 0xfffffffffffff;
      sStack_3f0.n[4] = sStack_3f0.n[4] + 0xffffffffffff;
      sStack_3f0.normalized = 0;
      sStack_3f0.magnitude = sStack_3f0.magnitude + 1;
      pcStack_458 = (code *)0x14c269;
      secp256k1_fe_verify(&sStack_3f0);
      pcStack_458 = (code *)0x14c271;
      secp256k1_fe_verify(&sStack_3f0);
      uVar48 = (sStack_3f0.n[4] >> 0x30) * 0x1000003d1 + sStack_3f0.n[0];
      uVar42 = (uVar48 >> 0x34) + sStack_3f0.n[1];
      uVar5 = (uVar42 >> 0x34) + sStack_3f0.n[2];
      psVar26 = (secp256k1_fe *)((uVar5 >> 0x34) + sStack_3f0.n[3]);
      uVar30 = ((ulong)psVar26 >> 0x34) + (sStack_3f0.n[4] & 0xffffffffffff);
      if ((((uVar42 | uVar48 | uVar5 | (ulong)psVar26) & 0xfffffffffffff) != 0 || uVar30 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar30 ^ 0xf000000000000),
         ((uVar48 ^ 0x1000003d0) & uVar42 & uVar5 & (ulong)psVar26 & (ulong)r_00) != 0xfffffffffffff
         )) goto LAB_0014c658;
      sStack_420.n[0] = psVar25->n[0];
      sStack_420.n[1] = psVar25->n[1];
      sStack_420.n[2] = psVar25->n[2];
      sStack_420.n[3] = psVar25->n[3];
      sStack_420.n[4] = psVar25->n[4];
      sStack_420.magnitude = psVar25->magnitude;
      sStack_420.normalized = psVar25->normalized;
      psVar25 = &sStack_420;
      pcStack_458 = (code *)0x14c317;
      secp256k1_fe_verify(psVar25);
      r_00 = &fe_minus_one;
      pcStack_458 = (code *)0x14c323;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_420.magnitude) goto LAB_0014c65d;
      sStack_420.n[0] = sStack_420.n[0] + 0xffffefffffc2e;
      sStack_420.n[1] = sStack_420.n[1] + 0xfffffffffffff;
      sStack_420.n[2] = sStack_420.n[2] + 0xfffffffffffff;
      sStack_420.n[3] = sStack_420.n[3] + 0xfffffffffffff;
      sStack_420.n[4] = sStack_420.n[4] + 0xffffffffffff;
      sStack_420.normalized = 0;
      sStack_420.magnitude = sStack_420.magnitude + 1;
      pcStack_458 = (code *)0x14c36e;
      secp256k1_fe_verify(&sStack_420);
      pcStack_458 = (code *)0x14c376;
      secp256k1_fe_verify(&sStack_420);
      uVar48 = (sStack_420.n[4] >> 0x30) * 0x1000003d1 + sStack_420.n[0];
      if (((uVar48 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar48 & 0xfffffffffffff) == 0)) {
        uVar42 = (uVar48 >> 0x34) + sStack_420.n[1];
        uVar5 = (uVar42 >> 0x34) + sStack_420.n[2];
        uVar30 = (uVar5 >> 0x34) + sStack_420.n[3];
        uVar32 = (uVar30 >> 0x34) + (sStack_420.n[4] & 0xffffffffffff);
        if (((uVar42 | uVar48 | uVar5 | uVar30) & 0xfffffffffffff) == 0 && uVar32 == 0) {
          return;
        }
        if (((uVar48 | 0x1000003d0) & uVar42 & uVar5 & uVar30 & (uVar32 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar26 = &sStack_420;
      pcStack_458 = (code *)0x14c425;
      (*pcVar39)();
      pcStack_458 = (code *)0x14c430;
      secp256k1_fe_verify(&sStack_450);
      r_00 = &fe_minus_one;
      pcStack_458 = (code *)0x14c43c;
      secp256k1_fe_verify(&fe_minus_one);
      psVar25 = &sStack_450;
      if (0x1f < sStack_450.magnitude) goto LAB_0014c662;
      sStack_450.n[0] = sStack_450.n[0] + 0xffffefffffc2e;
      sStack_450.n[1] = sStack_450.n[1] + 0xfffffffffffff;
      sStack_450.n[2] = sStack_450.n[2] + 0xfffffffffffff;
      sStack_450.n[3] = sStack_450.n[3] + 0xfffffffffffff;
      sStack_450.n[4] = sStack_450.n[4] + 0xffffffffffff;
      sStack_450.magnitude = sStack_450.magnitude + 1;
      sStack_450.normalized = 0;
      pcStack_458 = (code *)0x14c485;
      secp256k1_fe_verify(&sStack_450);
      pcStack_458 = (code *)0x14c48e;
      (*pcVar39)(&sStack_450);
      pcStack_458 = (code *)0x14c496;
      secp256k1_fe_verify(&sStack_450);
      sStack_450.n[0] = sStack_450.n[0] + 1;
      sStack_450.magnitude = sStack_450.magnitude + 1;
      sStack_450.normalized = 0;
      pcStack_458 = (code *)0x14c4a8;
      secp256k1_fe_verify(&sStack_450);
      pcStack_458 = (code *)0x14c4b0;
      secp256k1_fe_verify(&sStack_450);
      psVar26 = &sStack_420;
      pcStack_458 = (code *)0x14c4bd;
      r_00 = psVar26;
      secp256k1_fe_verify(psVar26);
      if (sStack_420.magnitude + sStack_450.magnitude < 0x21) {
        sStack_450.n[0] = sStack_450.n[0] + sStack_420.n[0];
        sStack_450.n[1] = sStack_450.n[1] + sStack_420.n[1];
        sStack_450.n[2] = sStack_450.n[2] + sStack_420.n[2];
        sStack_450.n[3] = sStack_450.n[3] + sStack_420.n[3];
        sStack_450.n[4] = sStack_450.n[4] + sStack_420.n[4];
        sStack_450.normalized = 0;
        pcStack_458 = (code *)0x14c509;
        sStack_450.magnitude = sStack_420.magnitude + sStack_450.magnitude;
        secp256k1_fe_verify(&sStack_450);
        pcStack_458 = (code *)0x14c511;
        secp256k1_fe_verify(&sStack_450);
        uVar48 = (sStack_450.n[4] >> 0x30) * 0x1000003d1 + sStack_450.n[0];
        if (((uVar48 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar48 & 0xfffffffffffff) == 0)) {
          uVar10 = (uVar48 >> 0x34) + sStack_450.n[1];
          uVar42 = (uVar10 >> 0x34) + sStack_450.n[2];
          uVar5 = (uVar42 >> 0x34) + sStack_450.n[3];
          uVar30 = (uVar5 >> 0x34) + (sStack_450.n[4] & 0xffffffffffff);
          if (((uVar10 | uVar48 | uVar42 | uVar5) & 0xfffffffffffff) == 0 && uVar30 == 0) {
            return;
          }
          if (((uVar48 | 0x1000003d0) & uVar10 & uVar42 & uVar5 & (uVar30 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_458 = (code *)0x14c5ba;
        test_inverse_field_cold_2();
        goto LAB_0014c5ba;
      }
    }
    else {
      pcStack_458 = (code *)0x14c658;
      test_inverse_field_cold_7();
LAB_0014c658:
      pcStack_458 = (code *)0x14c65d;
      test_inverse_field_cold_6();
LAB_0014c65d:
      pcStack_458 = (code *)0x14c662;
      test_inverse_field_cold_5();
LAB_0014c662:
      r = psVar26;
      psVar20 = psVar25;
      psVar26 = &sStack_3f0;
      pcStack_458 = (code *)0x14c667;
      test_inverse_field_cold_4();
    }
    pcStack_458 = (code *)0x14c66c;
    test_inverse_field_cold_3();
  }
  pcStack_458 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_458 = (code *)0xfffffffffffff;
  psVar25 = (secp256k1_fe *)auStack_4c8;
  pcVar49 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar49 = secp256k1_scalar_inverse;
  }
  pcStack_4d0 = (code *)0x14c69a;
  auStack_488._32_8_ = psVar20;
  auStack_488._40_8_ = psVar26;
  (*pcVar49)(auStack_4c8);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_4c8._20_4_,auStack_4c8._16_4_);
    r_00->n[3] = CONCAT44(auStack_4c8._28_4_,auStack_4c8._24_4_);
    r_00->n[0] = CONCAT44(auStack_4c8._4_4_,auStack_4c8._0_4_);
    r_00->n[1] = CONCAT44(auStack_4c8._12_4_,auStack_4c8._8_4_);
  }
  pcStack_4d0 = (code *)0x14c6b9;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar51._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar51._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar51._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar51._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar3 = movmskps(extraout_EAX,auVar51);
  if (iVar3 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_488;
    pcStack_4d0 = (code *)0x14c6ed;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_4c8);
    pcStack_4d0 = (code *)0x14c6f5;
    psVar20 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_488._0_8_ != 1 || auStack_488._8_8_ != 0) || auStack_488._16_8_ != 0) ||
        auStack_488._24_8_ != 0) {
      pcStack_4d0 = (code *)0x14c7ff;
      test_inverse_scalar_cold_1();
      goto LAB_0014c7ff;
    }
    pcStack_4d0 = (code *)0x14c725;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_4c8 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_4d0 = (code *)0x14c72d;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_4c8 + 0x20));
    auVar52._0_4_ = -(uint)(iStack_498 == 0 && auStack_4c8._32_4_ == 0);
    auVar52._4_4_ = -(uint)(iStack_494 == 0 && iStack_4a4 == 0);
    auVar52._8_4_ = -(uint)(iStack_490 == 0 && iStack_4a0 == 0);
    auVar52._12_4_ = -(uint)(iStack_48c == 0 && iStack_49c == 0);
    iVar3 = movmskps(extraout_EAX_00,auVar52);
    if (iVar3 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_4c8 + 0x20);
    pcStack_4d0 = (code *)0x14c75e;
    (*pcVar49)(a,a);
    pcStack_4d0 = (code *)0x14c773;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_4c8,&scalar_minus_one,(secp256k1_scalar *)auStack_4c8);
    pcStack_4d0 = (code *)0x14c77c;
    (*pcVar49)(auStack_4c8,auStack_4c8);
    pcStack_4d0 = (code *)0x14c78e;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_4c8,(secp256k1_scalar *)auStack_4c8,&secp256k1_scalar_one
              );
    pcStack_4d0 = (code *)0x14c79c;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_4c8,a,(secp256k1_scalar *)auStack_4c8);
    pcStack_4d0 = (code *)0x14c7a4;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_4c8);
    auVar53._0_4_ = -(uint)(auStack_4c8._16_4_ == 0 && auStack_4c8._0_4_ == 0);
    auVar53._4_4_ = -(uint)(auStack_4c8._20_4_ == 0 && auStack_4c8._4_4_ == 0);
    auVar53._8_4_ = -(uint)(auStack_4c8._24_4_ == 0 && auStack_4c8._8_4_ == 0);
    auVar53._12_4_ = -(uint)(auStack_4c8._28_4_ == 0 && auStack_4c8._12_4_ == 0);
    iVar3 = movmskps(extraout_EAX_01,auVar53);
    if (iVar3 == 0xf) {
      return;
    }
    pcStack_4d0 = (code *)0x14c7c8;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_4c8;
  }
  pcStack_4d0 = (code *)0x14c7d3;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_4c8);
  auVar54._0_4_ = -(uint)(auStack_4c8._16_4_ == 0 && auStack_4c8._0_4_ == 0);
  auVar54._4_4_ = -(uint)(auStack_4c8._20_4_ == 0 && auStack_4c8._4_4_ == 0);
  auVar54._8_4_ = -(uint)(auStack_4c8._24_4_ == 0 && auStack_4c8._8_4_ == 0);
  auVar54._12_4_ = -(uint)(auStack_4c8._28_4_ == 0 && auStack_4c8._12_4_ == 0);
  iVar3 = movmskps(extraout_EAX_02,auVar54);
  r = (secp256k1_fe *)auStack_4c8;
  psVar20 = psVar25;
  if (iVar3 == 0xf) {
    return;
  }
LAB_0014c7ff:
  pcStack_4d0 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_4e8 = 0x1000003d1;
  __s = auStack_1580;
  psStack_4f8 = r;
  pcStack_4f0 = pcVar39;
  psStack_4e0 = r_00;
  pcStack_4d8 = pcVar49;
  pcStack_4d0 = (code *)uVar10;
  memset(__s,0,0x1081);
  uStack_1590 = 0;
  lVar6 = 0x41;
  psStack_1588 = psVar20;
  secp256k1_hsort(__s,0x41,(size_t)psVar20,test_hsort_cmp,&uStack_1590);
  if (0x3f < uStack_1590) {
    test_hsort_is_sorted(auStack_1580,0x41,(size_t)psVar20);
    if (0 < COUNT) {
      iVar3 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_1580,count * (long)psVar20);
        secp256k1_hsort(auStack_1580,count,(size_t)psVar20,test_hsort_cmp,&uStack_1590);
        test_hsort_is_sorted(auStack_1580,count,(size_t)psVar20);
        iVar3 = iVar3 + 1;
      } while (iVar3 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar11 = 0;
    do {
      if (__s[lVar11] != *(uchar *)(lVar6 + lVar11)) {
        return;
      }
      lVar11 = lVar11 + 1;
    } while (extraout_RDX_01[1] != lVar11);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }

        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) == 0)));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}